

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

int light_pcapng_validate(light_pcapng p0,uint32_t *p1)

{
  _light_pcapng *p_Var1;
  int iVar2;
  size_t in_RAX;
  uint32_t *__s1;
  uint uVar3;
  size_t size;
  
  uVar3 = 0;
  size = in_RAX;
  while( true ) {
    if ((p0 == (light_pcapng)0x0) || (p1 == (uint *)0x0)) {
      return 1;
    }
    if ((p0->block_type != *p1) || (p0->block_total_lenght != p1[1])) break;
    size = 0;
    p_Var1 = p0->next_block;
    p0->next_block = (_light_pcapng *)0x0;
    __s1 = light_pcapng_to_memory(p0,&size);
    iVar2 = bcmp(__s1,p1,size);
    if (iVar2 != 0) {
      p0->next_block = p_Var1;
      free(__s1);
      fwrite("Block contents mismatch!\n",0x19,1,_stderr);
      return 0;
    }
    free(__s1);
    p0->next_block = p_Var1;
    p1 = (uint32_t *)((long)p1 + (ulong)(p1[1] & 0xfffffffc));
    uVar3 = uVar3 + 1;
    p0 = p_Var1;
  }
  fprintf(_stderr,"Block type or length mismatch at block %d!\n",(ulong)uVar3);
  fprintf(_stderr,"Expected type: 0x%X == 0x%X and expected length: %u == %u\n",
          (ulong)p0->block_type,(ulong)*p1,(ulong)p0->block_total_lenght,(ulong)p1[1]);
  return 0;
}

Assistant:

int light_pcapng_validate(light_pcapng p0, uint32_t *p1)
{
	light_pcapng iterator0 = p0;
	uint32_t *iterator1 = p1;
	int block_count = 0;

	while (iterator0 != NULL && iterator1 != NULL) { // XXX find a better stop condition.
		if (iterator0->block_type != iterator1[0] ||
				iterator0->block_total_lenght != iterator1[1]) {
			fprintf(stderr, "Block type or length mismatch at block %d!\n", block_count);
			fprintf(stderr, "Expected type: 0x%X == 0x%X and expected length: %u == %u\n",
					iterator0->block_type, iterator1[0], iterator0->block_total_lenght, iterator1[1]);
			return 0;
		}
		size_t size = 0;
		light_pcapng next_block = iterator0->next_block;
		iterator0->next_block = NULL; // This might be quite intrusive.
		uint32_t *mem = light_pcapng_to_memory(iterator0, &size);
		if (memcmp(mem, iterator1, size) != 0) {
			iterator0->next_block = next_block;
			free(mem);
			fprintf(stderr, "Block contents mismatch!\n");
			return 0;
		}

		free(mem);
		iterator0->next_block = next_block;
		iterator0 = iterator0->next_block;

		iterator1 += iterator1[1] / sizeof(uint32_t);
		block_count++;
	}

	return 1;
}